

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O0

void __thiscall Sexp::Dump(Sexp *this,ostream *stream)

{
  bool bVar1;
  Sexp *local_28;
  Sexp *cdr;
  Sexp *car;
  ostream *stream_local;
  Sexp *this_local;
  
  bVar1 = IsCons(this);
  if (bVar1) {
    std::operator<<(stream,"(");
    cdr = (this->field_1).cons.car;
    local_28 = (this->field_1).cons.cdr;
    while( true ) {
      if (cdr == (Sexp *)0x0) {
        __assert_fail("car != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
                      ,0x91,"void Sexp::Dump(std::ostream &) const");
      }
      if (local_28 == (Sexp *)0x0) {
        __assert_fail("cdr != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
                      ,0x92,"void Sexp::Dump(std::ostream &) const");
      }
      Dump(cdr,stream);
      bVar1 = IsEmpty(local_28);
      if (bVar1) break;
      bVar1 = IsCons(local_28);
      if (!bVar1) {
        std::operator<<(stream," . ");
        Dump(local_28,stream);
        break;
      }
      cdr = (local_28->field_1).cons.car;
      local_28 = (local_28->field_1).cons.cdr;
      std::operator<<(stream," ");
    }
    std::operator<<(stream,")");
  }
  else {
    DumpAtom(this,stream);
  }
  return;
}

Assistant:

void Sexp::Dump(std::ostream &stream) const {
  // Simple algorithm for pretty-printing an S-expression.
  // The algorithm goes like this:
  // 1) If self isn't a list, print it and return.
  // 2) If self is a list, print an open paren.
  //   2a) Print the car of the list.
  //   2b) If cdr is a list, recurse to step 2a with cdr as the new list
  //   2c) If cdr is (), print nothing,
  //   2d) If cdr is anything else, print a "." followed by a space
  //       and recursively print the cdr.
  if (!IsCons()) {
    DumpAtom(stream);
    return;
  }

  stream << "(";
  Sexp *car = this->cons.car;
  Sexp *cdr = this->cons.cdr;
  while (1) {
    assert(car != nullptr);
    assert(cdr != nullptr);
    car->Dump(stream);
    if (cdr->IsEmpty()) {
      break;
    }

    if (cdr->IsCons()) {
      car = cdr->cons.car;
      cdr = cdr->cons.cdr;
      stream << " ";
      continue;
    }

    stream << " . ";
    cdr->Dump(stream);
    break;
  }

  stream << ")";
}